

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O2

int MPIABI_Irsend(void *buf,int count,MPIABI_Datatype datatype,int dest,int tag,MPIABI_Comm comm,
                 MPIABI_Request *request)

{
  int iVar1;
  
  iVar1 = MPI_Irsend();
  return iVar1;
}

Assistant:

int MPIABI_Irsend(
  const void * buf,
  int count,
  MPIABI_Datatype datatype,
  int dest,
  int tag,
  MPIABI_Comm comm,
  MPIABI_Request * request
) {
  return MPI_Irsend(
    buf,
    count,
    (MPI_Datatype)(WPI_Datatype)datatype,
    dest,
    tag,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Request *)(WPI_RequestPtr)request
  );
}